

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mprog.c
# Opt level: O2

void pulse_prog_arangird_patrol(CHAR_DATA *mob)

{
  CHAR_DATA *pCVar1;
  bool bVar2;
  int iVar3;
  OBJ_DATA *pOVar4;
  CHAR_DATA **ppCVar5;
  long lStack_30;
  
  if (mob->fighting != (CHAR_DATA *)0x0) {
    return;
  }
  if (mob->in_room == (ROOM_INDEX_DATA *)0x0) {
    return;
  }
  iVar3 = number_percent();
  if (iVar3 < 0x46) {
    return;
  }
  switch(mob->in_room->vnum) {
  case 0x5557:
    do_south(mob,"");
    break;
  case 0x5558:
  case 0x5559:
    do_west(mob,"");
    break;
  case 0x555a:
  case 0x555c:
    do_west(mob,"");
    goto LAB_0033a8c0;
  case 0x555b:
    do_north(mob,"");
    break;
  case 0x555d:
    do_north(mob,"");
LAB_0033a8c0:
    lStack_30 = 0;
    goto LAB_0033a8c3;
  case 0x555e:
    do_north(mob,"");
    goto LAB_0033a8ab;
  case 0x555f:
  case 0x5563:
    do_east(mob,"");
    goto LAB_0033a885;
  case 0x5560:
    do_south(mob,"");
    goto LAB_0033a8ab;
  case 0x5561:
  case 0x5562:
    do_east(mob,"");
LAB_0033a8ab:
    lStack_30 = 1;
    goto LAB_0033a8c3;
  case 0x5564:
    do_south(mob,"");
LAB_0033a885:
    lStack_30 = 2;
    goto LAB_0033a8c3;
  default:
    goto switchD_0033a80e_default;
  }
  lStack_30 = 3;
LAB_0033a8c3:
  ppCVar5 = &mob->in_room->people;
  while (pCVar1 = *ppCVar5, pCVar1 != (CHAR_DATA *)0x0) {
    bVar2 = is_npc(pCVar1);
    if (((!bVar2) && (bVar2 = is_immortal(pCVar1), !bVar2)) &&
       ((pOVar4 = get_eq_char(pCVar1,0xc), pOVar4 == (OBJ_DATA *)0x0 ||
        (pOVar4->pIndexData->vnum != 0x5528)))) {
      do_yell(mob,"Intruder!  Sound the alarm!");
      do_murder(mob,pCVar1->name);
      return;
    }
    ppCVar5 = &pCVar1->next_in_room;
  }
  pCVar1 = ((mob->in_room->exit[lStack_30]->u1).to_room)->people;
  if (pCVar1 != (CHAR_DATA *)0x0) {
    act("You hear the heavy footsteps of an approaching patrol echo through the caves.",pCVar1,
        (void *)0x0,(void *)0x0,4);
    return;
  }
switchD_0033a80e_default:
  return;
}

Assistant:

void pulse_prog_arangird_patrol(CHAR_DATA *mob)
{
	CHAR_DATA *vch;
	OBJ_DATA *robes;
	int dir_next = -1;

	if (mob->fighting)
		return;

	if (!mob->in_room)
		return;

	if (number_percent() < 70)
		return;

	switch (mob->in_room->vnum)
	{
		case 21847:
			do_south(mob, "");
			dir_next = Directions::West;
			break;
		case 21848:
			do_west(mob, "");
			dir_next = Directions::West;
			break;
		case 21849:
			do_west(mob, "");
			dir_next = Directions::West;
			break;
		case 21850:
			do_west(mob, "");
			dir_next = Directions::North;
			break;
		case 21851:
			do_north(mob, "");
			dir_next = Directions::West;
			break;
		case 21852:
			do_west(mob, "");
			dir_next = Directions::North;
			break;
		case 21853:
			do_north(mob, "");
			dir_next = Directions::North;
			break;
		case 21854:
			do_north(mob, "");
			dir_next = Directions::East;
			break;
		case 21855:
			do_east(mob, "");
			dir_next = Directions::South;
			break;
		case 21856:
			do_south(mob, "");
			dir_next = Directions::East;
			break;
		case 21857:
			do_east(mob, "");
			dir_next = Directions::East;
			break;
		case 21858:
			do_east(mob, "");
			dir_next = Directions::East;
			break;
		case 21859:
			do_east(mob, "");
			dir_next = Directions::South;
			break;
		case 21860:
			do_south(mob, "");
			dir_next = Directions::South;
			break;
		default:
			return;
	}

	for (vch = mob->in_room->people; vch; vch = vch->next_in_room)
	{
		if (is_npc(vch))
			continue;

		if (is_immortal(vch))
			continue;

		if ((robes = get_eq_char(vch, WEAR_ABOUT)) != nullptr && robes->pIndexData->vnum == 21800)
			continue;

		do_yell(mob, "Intruder!  Sound the alarm!");
		do_murder(mob, vch->name);
		return;
	}

	if (mob->in_room->exit[dir_next]->u1.to_room->people)
	{
		act("You hear the heavy footsteps of an approaching patrol echo through the caves.",
			mob->in_room->exit[dir_next]->u1.to_room->people, 0, 0, TO_ALL);
	}
}